

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

uint16_t mpack_expect_native_u16(mpack_reader_t *reader)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  uint16_t type;
  mpack_reader_t *reader_local;
  
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    _Var1 = mpack_reader_ensure(reader,2);
    if (_Var1) {
      reader_local._6_2_ = mpack_load_u16(reader->data);
      reader->data = reader->data + 2;
    }
    else {
      reader_local._6_2_ = 0;
    }
  }
  else {
    reader_local._6_2_ = 0;
  }
  return reader_local._6_2_;
}

Assistant:

MPACK_STATIC_INLINE uint16_t mpack_expect_native_u16(mpack_reader_t* reader) {
    if (mpack_reader_error(reader) != mpack_ok)
        return 0;
    uint16_t type;
    if (!mpack_reader_ensure(reader, sizeof(type)))
        return 0;
    type = mpack_load_u16(reader->data);
    reader->data += sizeof(type);
    return type;
}